

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O1

DynamicProfileInfo *
Js::DynamicProfileInfo::New
          (Recycler *recycler,FunctionBody *functionBody,bool persistsAcrossScriptContexts)

{
  char *addr;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  BOOL BVar4;
  long lVar5;
  Recycler *pRVar6;
  undefined4 *puVar7;
  DynamicProfileInfo *this;
  type_info *ptVar8;
  type_info *ptVar9;
  DynamicProfileInfo *pDVar10;
  ulong uVar11;
  undefined1 local_150 [8];
  TrackAllocData data;
  Allocation batch [14];
  
  data.line = 8;
  FunctionBody::GetCountField(functionBody,ProfiledCallApplyCallSiteCount);
  FunctionBody::GetCountField(functionBody,InlineCacheCount);
  bVar2 = IsEnabled(functionBody);
  if (bVar2) {
    FunctionBody::GetCountField(functionBody,LoopCount);
  }
  uVar3 = FunctionBody::GetCountField(functionBody,LoopCount);
  if (uVar3 != 0) {
    uVar3 = FunctionBody::GetCountField(functionBody,LoopCount);
    BVFixed::GetAllocSize(uVar3 * 2);
  }
  lVar5 = 8;
  ptVar8 = (type_info *)0x0;
  do {
    ptVar8 = ptVar8 + *(long *)((long)batch + lVar5 + -8);
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0xe8);
  data.typeinfo = ptVar8;
  if (persistsAcrossScriptContexts) {
    local_150 = (undefined1  [8])&typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_499f363;
    data.filename._0_4_ = 0x5e;
    pRVar6 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_150);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_009702ca;
      *puVar7 = 0;
    }
    ptVar9 = (type_info *)&DAT_ffffffffffffffff;
    if (ptVar8 < (type_info *)0xffffffffffffff58) {
      ptVar9 = ptVar8 + 0xa8;
    }
    this = (DynamicProfileInfo *)
           Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                     (pRVar6,(size_t)ptVar9);
    if (this == (DynamicProfileInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x20d,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_009702ca;
      *puVar7 = 0;
    }
    DynamicProfileInfo(this,functionBody);
    this->persistsAcrossScriptContexts = true;
  }
  else {
    local_150 = (undefined1  [8])&typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_499f363;
    data.filename._0_4_ = 0x68;
    pRVar6 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_150);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_009702ca;
      *puVar7 = 0;
    }
    ptVar9 = (type_info *)&DAT_ffffffffffffffff;
    if (ptVar8 < (type_info *)0xffffffffffffff58) {
      ptVar9 = ptVar8 + 0xa8;
    }
    this = (DynamicProfileInfo *)
           Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                     (pRVar6,(size_t)ptVar9);
    if (this == (DynamicProfileInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x20d,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_009702ca;
      *puVar7 = 0;
    }
    DynamicProfileInfo(this,functionBody);
  }
  pDVar10 = this + 1;
  lVar5 = 8;
  do {
    if (*(long *)((long)batch + lVar5 + -8) != 0) {
      uVar11 = (ulong)*(uint *)((long)&batch[-1].offset + lVar5);
      addr = (char *)((long)&(this->dynamicProfileFunctionInfo).ptr + uVar11);
      Memory::Recycler::WBSetBit(addr);
      *(DynamicProfileInfo **)((long)&(this->dynamicProfileFunctionInfo).ptr + uVar11) = pDVar10;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      pDVar10 = (DynamicProfileInfo *)
                ((long)&(pDVar10->dynamicProfileFunctionInfo).ptr +
                *(long *)((long)batch + lVar5 + -8));
    }
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0xe8);
  if ((type_info *)((long)pDVar10 + (-0xa8 - (long)this)) != ptVar8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x7b,
                                "(current - reinterpret_cast<BYTE*>(info) - sizeof(DynamicProfileInfo) == totalAlloc)"
                                ,
                                "current - reinterpret_cast<BYTE*>(info) - sizeof(DynamicProfileInfo) == totalAlloc"
                               );
    if (!bVar2) {
LAB_009702ca:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  Initialize(this,functionBody);
  return this;
}

Assistant:

DynamicProfileInfo* DynamicProfileInfo::New(Recycler* recycler, FunctionBody* functionBody, bool persistsAcrossScriptContexts)
    {
        size_t totalAlloc = 0;
        Allocation batch[] =
        {
            { (uint)offsetof(DynamicProfileInfo, callSiteInfo), functionBody->GetProfiledCallSiteCount() * sizeof(CallSiteInfo) },
            { (uint)offsetof(DynamicProfileInfo, callApplyTargetInfo), functionBody->GetProfiledCallApplyCallSiteCount() * sizeof(CallSiteInfo) },
            { (uint)offsetof(DynamicProfileInfo, ldLenInfo), functionBody->GetProfiledLdLenCount() * sizeof(LdLenInfo) },
            { (uint)offsetof(DynamicProfileInfo, ldElemInfo), functionBody->GetProfiledLdElemCount() * sizeof(LdElemInfo) },
            { (uint)offsetof(DynamicProfileInfo, stElemInfo), functionBody->GetProfiledStElemCount() * sizeof(StElemInfo) },
            { (uint)offsetof(DynamicProfileInfo, arrayCallSiteInfo), functionBody->GetProfiledArrayCallSiteCount() * sizeof(ArrayCallSiteInfo) },
            { (uint)offsetof(DynamicProfileInfo, fldInfo), functionBody->GetProfiledFldCount() * sizeof(FldInfo) },
            { (uint)offsetof(DynamicProfileInfo, divideTypeInfo), functionBody->GetProfiledDivOrRemCount() * sizeof(ValueType) },
            { (uint)offsetof(DynamicProfileInfo, switchTypeInfo), functionBody->GetProfiledSwitchCount() * sizeof(ValueType)},
            { (uint)offsetof(DynamicProfileInfo, slotInfo), functionBody->GetProfiledSlotCount() * sizeof(ValueType) },
            { (uint)offsetof(DynamicProfileInfo, parameterInfo), functionBody->GetProfiledInParamsCount() * sizeof(ValueType) },
            { (uint)offsetof(DynamicProfileInfo, returnTypeInfo), functionBody->GetProfiledReturnTypeCount() * sizeof(ValueType) },
            { (uint)offsetof(DynamicProfileInfo, loopImplicitCallFlags), (EnableImplicitCallFlags(functionBody) ? (functionBody->GetLoopCount() * sizeof(ImplicitCallFlags)) : 0) },
            { (uint)offsetof(DynamicProfileInfo, loopFlags), functionBody->GetLoopCount() ? BVFixed::GetAllocSize(functionBody->GetLoopCount() * LoopFlags::COUNT) : 0 }
        };

        for (uint i = 0; i < _countof(batch); i++)
        {
            totalAlloc += batch[i].size;
        }

        DynamicProfileInfo* info = nullptr;

        // In the profile storage case (-only), always allocate a non-leaf profile
        // In the regular profile case, we need to allocate it as non-leaf only if it's
        // a profile being used in the in-memory cache. This is because in that case, the profile
        // also allocates dynamicProfileFunctionInfo, which it uses to match functions across
        // script contexts. In the normal case, since we don't allocate that structure, we
        // can be a leaf allocation.
        if (persistsAcrossScriptContexts)
        {
            info = RecyclerNewPlusZ(recycler, totalAlloc, DynamicProfileInfo, functionBody);
#if DBG
            info->persistsAcrossScriptContexts = true;
#endif
        }
        else
        {
#if DBG_DUMP || defined(DYNAMIC_PROFILE_STORAGE) || defined(RUNTIME_DATA_COLLECTION)
            if (DynamicProfileInfo::NeedProfileInfoList())
            {
                info = RecyclerNewPlusZ(recycler, totalAlloc, DynamicProfileInfo, functionBody);
            }
            else
#endif
            {
                info = RecyclerNewPlusLeafZ(recycler, totalAlloc, DynamicProfileInfo, functionBody);
            }
        }
        BYTE* current = (BYTE*)info + sizeof(DynamicProfileInfo);

        for (uint i = 0; i < _countof(batch); i++)
        {
            if (batch[i].size > 0)
            {
                Field(BYTE*)* field = (Field(BYTE*)*)(((BYTE*)info + batch[i].offset));
                *field = current;
                current += batch[i].size;
            }
        }
        Assert(current - reinterpret_cast<BYTE*>(info) - sizeof(DynamicProfileInfo) == totalAlloc);

        info->Initialize(functionBody);
        return info;
    }